

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O0

void SetCycErrorNotifyMask(EC_T_DWORD dwInstanceID,EC_T_DWORD dwCycErrorNotifyMask)

{
  EC_T_DWORD local_10;
  EC_T_DWORD local_c;
  EC_T_DWORD dwCycErrorNotifyMask_local;
  EC_T_DWORD dwInstanceID_local;
  
  local_10 = dwCycErrorNotifyMask;
  local_c = dwInstanceID;
  emIoCtl(dwInstanceID,8,&local_10,4,(void *)0x0,0,(EC_T_DWORD *)0x0);
  return;
}

Assistant:

EC_T_VOID SetCycErrorNotifyMask
    (EC_T_DWORD          dwInstanceID
    ,EC_T_DWORD          dwCycErrorNotifyMask )
{
    emIoCtl(dwInstanceID, EC_IOCTL_SET_CYC_ERROR_NOTIFY_MASK, &dwCycErrorNotifyMask, sizeof(EC_T_DWORD), EC_NULL, 0, EC_NULL);
}